

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void __thiscall
llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::DestroyAll
          (SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode> *this)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  pair<void_*,_unsigned_long> *PtrAndSize;
  ulong *puVar5;
  uintptr_t ArithAddr_1;
  long *plVar6;
  uintptr_t ArithAddr;
  long *plVar7;
  long *plVar8;
  ulong *puVar9;
  
  if ((ulong)*(uint *)(this + 0x18) != 0) {
    puVar9 = *(ulong **)(this + 0x10);
    puVar5 = puVar9 + *(uint *)(this + 0x18);
    do {
      uVar4 = (uint)((ulong)((long)puVar9 - *(long *)(this + 0x10)) >> 10) & 0x1ffffff;
      bVar3 = (byte)uVar4;
      if (0x1d < uVar4) {
        bVar3 = 0x1e;
      }
      uVar1 = *puVar9;
      if (0xfffffffffffffff8 < uVar1) goto LAB_001cf92c;
      if ((ulong)*(uint *)(this + 0x18) == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                      ,0xa7,"reference llvm::SmallVectorTemplateCommon<void *>::back() [T = void *]"
                     );
      }
      if (uVar1 == *(ulong *)(*(long *)(this + 0x10) + -8 + (ulong)*(uint *)(this + 0x18) * 8)) {
        plVar6 = *(long **)this;
      }
      else {
        plVar6 = (long *)((0x1000L << (bVar3 & 0x3f)) + uVar1);
      }
      plVar7 = (long *)(uVar1 + 7 & 0xfffffffffffffff8);
      plVar8 = plVar7 + 0xb;
      while (plVar8 <= plVar6) {
        (**(code **)(*plVar7 + 8))(plVar7);
        plVar8 = plVar7 + 0x16;
        plVar7 = plVar7 + 0xb;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar5);
  }
  if ((ulong)*(uint *)(this + 0x48) != 0) {
    puVar5 = *(ulong **)(this + 0x40);
    puVar9 = puVar5 + (ulong)*(uint *)(this + 0x48) * 2;
    do {
      uVar1 = *puVar5;
      if (0xfffffffffffffff8 < uVar1) {
LAB_001cf92c:
        __assert_fail("static_cast<uintptr_t>(ArithAddr + Alignment.value() - 1) >= ArithAddr && \"Overflow\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                      ,0xbb,"uintptr_t llvm::alignAddr(const void *, Align)");
      }
      plVar8 = (long *)(uVar1 + 7 & 0xfffffffffffffff8);
      uVar2 = puVar5[1];
      plVar6 = plVar8 + 0xb;
      while (plVar6 <= (long *)(uVar1 + uVar2)) {
        (**(code **)(*plVar8 + 8))(plVar8);
        plVar6 = plVar8 + 0x16;
        plVar8 = plVar8 + 0xb;
      }
      puVar5 = puVar5 + 2;
    } while (puVar5 != puVar9);
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset
            ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)this);
  return;
}

Assistant:

void DestroyAll() {
    auto DestroyElements = [](char *Begin, char *End) {
      assert(Begin == (char *)alignAddr(Begin, Align::Of<T>()));
      for (char *Ptr = Begin; Ptr + sizeof(T) <= End; Ptr += sizeof(T))
        reinterpret_cast<T *>(Ptr)->~T();
    };

    for (auto I = Allocator.Slabs.begin(), E = Allocator.Slabs.end(); I != E;
         ++I) {
      size_t AllocatedSlabSize = BumpPtrAllocator::computeSlabSize(
          std::distance(Allocator.Slabs.begin(), I));
      char *Begin = (char *)alignAddr(*I, Align::Of<T>());
      char *End = *I == Allocator.Slabs.back() ? Allocator.CurPtr
                                               : (char *)*I + AllocatedSlabSize;

      DestroyElements(Begin, End);
    }

    for (auto &PtrAndSize : Allocator.CustomSizedSlabs) {
      void *Ptr = PtrAndSize.first;
      size_t Size = PtrAndSize.second;
      DestroyElements((char *)alignAddr(Ptr, Align::Of<T>()),
                      (char *)Ptr + Size);
    }

    Allocator.Reset();
  }